

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_stressbuffer(char *args)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  undefined8 uVar7;
  time_t tVar8;
  ulong uVar9;
  PHYSFS_uint32 left_1;
  PHYSFS_uint32 right_1;
  PHYSFS_uint32 left;
  PHYSFS_uint32 right;
  char buf2 [37];
  char local_68 [8];
  char buf [37];
  uint local_34;
  uint local_30;
  int j;
  int i;
  int rndnum;
  PHYSFS_File *f;
  char *pcStack_18;
  int num;
  char *args_local;
  
  pcStack_18 = args;
  if (*args == '\"') {
    pcStack_18 = args + 1;
    sVar5 = strlen(pcStack_18);
    pcStack_18[sVar5 - 1] = '\0';
  }
  uVar1 = atoi(pcStack_18);
  if ((int)uVar1 < 0) {
    printf("buffer must be greater than or equal to zero.\n");
  }
  else {
    printf("Stress testing with (%d) byte buffer...\n",(ulong)uVar1);
    lVar6 = PHYSFS_openWrite("test.txt");
    if (lVar6 == 0) {
      uVar7 = PHYSFS_getLastError();
      printf("Couldn\'t open test.txt for writing: %s.\n",uVar7);
    }
    else {
      iVar2 = PHYSFS_setBuffer(lVar6,(long)(int)uVar1);
      if (iVar2 == 0) {
        uVar7 = PHYSFS_getLastError();
        printf("PHYSFS_setBuffer() failed: %s.\n",uVar7);
        PHYSFS_close(lVar6);
        PHYSFS_delete("test.txt");
      }
      else {
        strcpy(local_68,"abcdefghijklmnopqrstuvwxyz0123456789");
        tVar8 = time((time_t *)0x0);
        srand((uint)tVar8);
        for (local_30 = 0; (int)local_30 < 10; local_30 = local_30 + 1) {
          for (local_34 = 0; (int)local_34 < 10000; local_34 = local_34 + 1) {
            iVar2 = rand();
            uVar3 = (int)(long)((double)iVar2 * 35.0 * 4.656612873077393e-10) + 1;
            uVar4 = 0x24 - uVar3;
            uVar9 = PHYSFS_writeBytes(lVar6,local_68,uVar4);
            if (uVar9 != uVar4) {
              uVar7 = PHYSFS_getLastError();
              printf("PHYSFS_writeBytes() failed: %s.\n",uVar7);
              PHYSFS_close(lVar6);
              return 1;
            }
            iVar2 = rand();
            if (((int)(((double)iVar2 * 1000.0) / 2147483648.0) == 0x29) &&
               (iVar2 = PHYSFS_flush(lVar6), iVar2 == 0)) {
              uVar7 = PHYSFS_getLastError();
              printf("PHYSFS_flush() failed: %s.\n",uVar7);
              PHYSFS_close(lVar6);
              return 1;
            }
            uVar9 = PHYSFS_writeBytes(lVar6,local_68 + uVar4,uVar3);
            if (uVar9 != uVar3) {
              uVar7 = PHYSFS_getLastError();
              printf("PHYSFS_writeBytes() failed: %s.\n",uVar7);
              PHYSFS_close(lVar6);
              return 1;
            }
            iVar2 = rand();
            if (((int)(((double)iVar2 * 1000.0) / 2147483648.0) == 0x29) &&
               (iVar2 = PHYSFS_flush(lVar6), iVar2 == 0)) {
              uVar7 = PHYSFS_getLastError();
              printf("PHYSFS_flush() failed: %s.\n",uVar7);
              PHYSFS_close(lVar6);
              return 1;
            }
          }
          iVar2 = PHYSFS_flush(lVar6);
          if (iVar2 == 0) {
            uVar7 = PHYSFS_getLastError();
            printf("PHYSFS_flush() failed: %s.\n",uVar7);
            PHYSFS_close(lVar6);
            return 1;
          }
        }
        iVar2 = PHYSFS_close(lVar6);
        if (iVar2 == 0) {
          uVar7 = PHYSFS_getLastError();
          printf("PHYSFS_close() failed: %s.\n",uVar7);
        }
        else {
          printf(" ... test file written ...\n");
          lVar6 = PHYSFS_openRead("test.txt");
          if (lVar6 == 0) {
            uVar7 = PHYSFS_getLastError();
            printf("Failed to reopen stress file for reading: %s.\n",uVar7);
          }
          else {
            iVar2 = PHYSFS_setBuffer(lVar6,(long)(int)uVar1);
            if (iVar2 == 0) {
              uVar7 = PHYSFS_getLastError();
              printf("PHYSFS_setBuffer() failed: %s.\n",uVar7);
              PHYSFS_close(lVar6);
            }
            else {
              for (local_30 = 0; (int)local_30 < 10; local_30 = local_30 + 1) {
                for (local_34 = 0; (int)local_34 < 10000; local_34 = local_34 + 1) {
                  iVar2 = rand();
                  uVar1 = (int)(long)((double)iVar2 * 35.0 * 4.656612873077393e-10) + 1;
                  uVar3 = 0x24 - uVar1;
                  uVar9 = PHYSFS_readBytes(lVar6,&left,uVar3);
                  if (uVar9 != uVar3) {
                    uVar7 = PHYSFS_getLastError();
                    printf("PHYSFS_readBytes() failed: %s.\n",uVar7);
                    PHYSFS_close(lVar6);
                    return 1;
                  }
                  iVar2 = rand();
                  if (((int)(((double)iVar2 * 1000.0) / 2147483648.0) == 0x29) &&
                     (iVar2 = PHYSFS_flush(lVar6), iVar2 == 0)) {
                    uVar7 = PHYSFS_getLastError();
                    printf("PHYSFS_flush() failed: %s.\n",uVar7);
                    PHYSFS_close(lVar6);
                    return 1;
                  }
                  uVar9 = PHYSFS_readBytes(lVar6,(long)&left + (ulong)uVar3,uVar1);
                  if (uVar9 != uVar1) {
                    uVar7 = PHYSFS_getLastError();
                    printf("PHYSFS_readBytes() failed: %s.\n",uVar7);
                    PHYSFS_close(lVar6);
                    return 1;
                  }
                  iVar2 = rand();
                  if (((int)(((double)iVar2 * 1000.0) / 2147483648.0) == 0x29) &&
                     (iVar2 = PHYSFS_flush(lVar6), iVar2 == 0)) {
                    uVar7 = PHYSFS_getLastError();
                    printf("PHYSFS_flush() failed: %s.\n",uVar7);
                    PHYSFS_close(lVar6);
                    return 1;
                  }
                  iVar2 = memcmp(local_68,&left,0x24);
                  if (iVar2 != 0) {
                    printf("readback is mismatched on iterations (%d, %d).\n",(ulong)local_30,
                           (ulong)local_34);
                    printf("wanted: [");
                    for (local_30 = 0; (int)local_30 < 0x24; local_30 = local_30 + 1) {
                      printf("%c",(ulong)(uint)(int)local_68[(int)local_30]);
                    }
                    printf("]\n");
                    printf("   got: [");
                    for (local_30 = 0; (int)local_30 < 0x24; local_30 = local_30 + 1) {
                      printf("%c",(ulong)(uint)(int)*(char *)((long)&left + (long)(int)local_30));
                    }
                    printf("]\n");
                    PHYSFS_close(lVar6);
                    return 1;
                  }
                }
                iVar2 = PHYSFS_flush(lVar6);
                if (iVar2 == 0) {
                  uVar7 = PHYSFS_getLastError();
                  printf("PHYSFS_flush() failed: %s.\n",uVar7);
                  PHYSFS_close(lVar6);
                  return 1;
                }
              }
              printf(" ... test file read ...\n");
              iVar2 = PHYSFS_eof(lVar6);
              if (iVar2 == 0) {
                printf("PHYSFS_eof() returned true! That\'s wrong.\n");
              }
              iVar2 = PHYSFS_close(lVar6);
              if (iVar2 == 0) {
                uVar7 = PHYSFS_getLastError();
                printf("PHYSFS_close() failed: %s.\n",uVar7);
              }
              else {
                PHYSFS_delete("test.txt");
                printf("stress test completed successfully.\n");
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

static int cmd_stressbuffer(char *args)
{
    int num;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    num = atoi(args);
    if (num < 0)
        printf("buffer must be greater than or equal to zero.\n");
    else
    {
        PHYSFS_File *f;
        int rndnum;

        printf("Stress testing with (%d) byte buffer...\n", num);
        f = PHYSFS_openWrite("test.txt");
        if (f == NULL)
            printf("Couldn't open test.txt for writing: %s.\n", PHYSFS_getLastError());
        else
        {
            int i, j;
            char buf[37];
            char buf2[37];

            if (!PHYSFS_setBuffer(f, num))
            {
                printf("PHYSFS_setBuffer() failed: %s.\n", PHYSFS_getLastError());
                PHYSFS_close(f);
                PHYSFS_delete("test.txt");
                return 1;
            } /* if */

            strcpy(buf, "abcdefghijklmnopqrstuvwxyz0123456789");
            srand((unsigned int) time(NULL));

            for (i = 0; i < 10; i++)
            {
                for (j = 0; j < 10000; j++)
                {
                    PHYSFS_uint32 right = 1 + (PHYSFS_uint32) (35.0 * rand() / (RAND_MAX + 1.0));
                    PHYSFS_uint32 left = 36 - right;
                    if (PHYSFS_writeBytes(f, buf, left) != left)
                    {
                        printf("PHYSFS_writeBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */

                    if (PHYSFS_writeBytes(f, buf + left, right) != right)
                    {
                        printf("PHYSFS_writeBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */
                } /* for */

                if (!PHYSFS_flush(f))
                {
                    printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                    PHYSFS_close(f);
                    return 1;
                } /* if */

            } /* for */

            if (!PHYSFS_close(f))
            {
                printf("PHYSFS_close() failed: %s.\n", PHYSFS_getLastError());
                return 1;  /* oh well. */
            } /* if */

            printf(" ... test file written ...\n");
            f = PHYSFS_openRead("test.txt");
            if (f == NULL)
            {
                printf("Failed to reopen stress file for reading: %s.\n", PHYSFS_getLastError());
                return 1;
            } /* if */

            if (!PHYSFS_setBuffer(f, num))
            {
                printf("PHYSFS_setBuffer() failed: %s.\n", PHYSFS_getLastError());
                PHYSFS_close(f);
                return 1;
            } /* if */

            for (i = 0; i < 10; i++)
            {
                for (j = 0; j < 10000; j++)
                {
                    PHYSFS_uint32 right = 1 + (PHYSFS_uint32) (35.0 * rand() / (RAND_MAX + 1.0));
                    PHYSFS_uint32 left = 36 - right;
                    if (PHYSFS_readBytes(f, buf2, left) != left)
                    {
                        printf("PHYSFS_readBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */

                    if (PHYSFS_readBytes(f, buf2 + left, right) != right)
                    {
                        printf("PHYSFS_readBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */

                    if (memcmp(buf, buf2, 36) != 0)
                    {
                        printf("readback is mismatched on iterations (%d, %d).\n", i, j);
                        printf("wanted: [");
                        for (i = 0; i < 36; i++)
                            printf("%c", buf[i]);
                        printf("]\n");

                        printf("   got: [");
                        for (i = 0; i < 36; i++)
                            printf("%c", buf2[i]);
                        printf("]\n");
                        PHYSFS_close(f);
                        return 1;
                    } /* if */
                } /* for */

                if (!PHYSFS_flush(f))
                {
                    printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                    PHYSFS_close(f);
                    return 1;
                } /* if */

            } /* for */

            printf(" ... test file read ...\n");

            if (!PHYSFS_eof(f))
                printf("PHYSFS_eof() returned true! That's wrong.\n");

            if (!PHYSFS_close(f))
            {
                printf("PHYSFS_close() failed: %s.\n", PHYSFS_getLastError());
                return 1;  /* oh well. */
            } /* if */

            PHYSFS_delete("test.txt");
            printf("stress test completed successfully.\n");
        } /* else */
    } /* else */

    return 1;
}